

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int modified_set_undeliverable_here(MODIFIED_HANDLE modified,_Bool undeliverable_here_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  MODIFIED_INSTANCE *modified_instance;
  
  if (modified == (MODIFIED_HANDLE)0x0) {
    iVar2 = 0x47e8;
  }
  else {
    item_value = amqpvalue_create_boolean(undeliverable_here_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x47f0;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(modified->composite_value,1,item_value);
      iVar2 = 0x47f6;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int modified_set_undeliverable_here(MODIFIED_HANDLE modified, bool undeliverable_here_value)
{
    int result;

    if (modified == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)modified;
        AMQP_VALUE undeliverable_here_amqp_value = amqpvalue_create_boolean(undeliverable_here_value);
        if (undeliverable_here_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(modified_instance->composite_value, 1, undeliverable_here_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(undeliverable_here_amqp_value);
        }
    }

    return result;
}